

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_async_future.cpp
# Opt level: O2

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint __line;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ostream *poVar6;
  char *pcVar7;
  __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
  *__r;
  __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
  *__r_00;
  int result;
  async_future<int> f0_2;
  async_future<int> f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8 [2];
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:58:29)>::type_(async_future<int>)>::type,_async_future_clang_workaround>
  f1;
  promise<int> promise;
  unique_lock<std::mutex> lock;
  anon_class_32_2_fc850240_for_move_only_function_ continuation;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  promise<int> local_48;
  int *local_38;
  promise<void> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  continuation._0_4_ = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            (&f0,(int *)&continuation);
  if (f0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    pcVar7 = "f0.valid()";
    __line = 0x24;
  }
  else {
    bVar3 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                      (f0.ptr_to_state_.
                       super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (bVar3) {
      iVar4 = std::experimental::v1::detail::async_future<int>::get(&f0);
      if (iVar4 == 0xd) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&f0.ptr_to_state_.
                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
        if (f0.ptr_to_state_.
            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          pcVar7 = "f0.valid()";
          __line = 0x2e;
        }
        else {
          bVar3 = std::experimental::v1::detail::asynchronous_state<void>::is_ready
                            ((asynchronous_state<void> *)
                             f0.ptr_to_state_.
                             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          if (bVar3) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&f0.ptr_to_state_.
                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            f0.ptr_to_state_.
            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)
                      CONCAT44(f0.ptr_to_state_.
                               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,0xd);
            std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
                      (&f0_2,(int *)&f0);
            if (f0_2.ptr_to_state_.
                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr == (element_type *)0x0) {
              pcVar7 = "f0.valid()";
              __line = 0x36;
            }
            else {
              bVar3 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                                (f0_2.ptr_to_state_.
                                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
              if (bVar3) {
                if (f0_2.ptr_to_state_.
                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == (element_type *)0x0) {
                  pcVar7 = 
                  "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = int, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:58:29)]"
                  ;
                  goto LAB_00102f42;
                }
                std::make_shared<std::experimental::v1::detail::asynchronous_state<int>>();
                std::experimental::v1::promise<int>::get_async_future((promise<int> *)&f1);
                std::experimental::v1::promise<int>::promise(&local_48,&promise);
                peVar2 = f0_2.ptr_to_state_.
                         super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                std::experimental::v1::promise<int>::promise(&continuation.f.promise,&local_48);
                std::unique_lock<std::mutex>::unique_lock(&lock,&peVar2->mutex_);
                if ((peVar2->maybe_result_).has_value_ == true) {
                  std::unique_lock<std::mutex>::unlock(&lock);
                  std::experimental::v1::detail::asynchronous_state<int>::to_async_future
                            ((asynchronous_state<int> *)&f0);
                  std::experimental::v1::detail::
                  copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
                  ::anon_class_32_2_fc850240_for_move_only_function_::operator()(&continuation,&f0);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&f0.ptr_to_state_.
                              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  peVar2->continuation_complete_ = true;
                }
                else {
                  p_Var1 = &f0.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
                  std::experimental::v1::promise<int>::promise
                            ((promise<int> *)p_Var1,&continuation.f.promise);
                  local_58 = (_Manager_type)0x0;
                  p_Stack_50 = (_Invoker_type)0x0;
                  local_68._M_unused._M_object = (void *)0x0;
                  local_68._8_8_ = 0;
                  pvVar5 = operator_new(0x20);
                  std::experimental::v1::promise<int>::promise
                            ((promise<int> *)((long)pvVar5 + 8),(promise<int> *)p_Var1);
                  p_Stack_50 = std::
                               _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                               ::_M_invoke;
                  local_58 = std::
                             _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                             ::_M_manager;
                  local_68._M_unused._M_object = pvVar5;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
                  std::function<void_(std::experimental::v1::detail::async_future<int>)>::operator=
                            (&(peVar2->continuation_).
                              super_function<void_(std::experimental::v1::detail::async_future<int>)>
                             ,(function<void_(std::experimental::v1::detail::async_future<int>)> *)
                              &local_68);
                  std::_Function_base::~_Function_base((_Function_base *)&local_68);
                }
                std::unique_lock<std::mutex>::~unique_lock(&lock);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&continuation.f.promise.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                f0.ptr_to_state_.
                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                f0.ptr_to_state_.
                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                std::
                __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                ::operator=((__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                             *)&f0_2,(__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                      *)&f0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&f0.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_48.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&promise.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                iVar4 = std::experimental::v1::detail::async_future<int>::get(&f1);
                if (iVar4 == 0x14) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&f1.ptr_to_state_.
                              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&f0_2.ptr_to_state_.
                              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  f0.ptr_to_state_.
                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)
                            CONCAT44(f0.ptr_to_state_.
                                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,0xd);
                  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
                            (&f0_2,(int *)&f0);
                  if (f0_2.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr == (element_type *)0x0) {
                    pcVar7 = "f0.valid()";
                    __line = 0x48;
                  }
                  else {
                    bVar3 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                                      (f0_2.ptr_to_state_.
                                       super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
                    if (bVar3) {
                      result = 0;
                      if (f0_2.ptr_to_state_.
                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr == (element_type *)0x0) {
                        pcVar7 = 
                        "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = int, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:77:29)]"
                        ;
                        goto LAB_00102f42;
                      }
                      std::make_shared<std::experimental::v1::detail::asynchronous_state<void>>();
                      std::experimental::v1::promise<void>::get_async_future((promise<void> *)&f1);
                      std::experimental::v1::promise<void>::promise
                                ((promise<void> *)&local_48,&promise);
                      peVar2 = f0_2.ptr_to_state_.
                               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      local_38 = &result;
                      std::experimental::v1::detail::
                      one_way_executor_then<int,has_execute_member,main::$_1>(std::experimental::v1::detail::async_future<int>&,has_execute_member_const&,main::$_1&&)
                      ::{lambda(std::experimental::v1::detail::async_future<int>)#1}::
                      async_future<int>__1____(&continuation.f,(type *)&local_48);
                      std::unique_lock<std::mutex>::unique_lock(&lock,&peVar2->mutex_);
                      if ((peVar2->maybe_result_).has_value_ == true) {
                        std::unique_lock<std::mutex>::unlock(&lock);
                        std::experimental::v1::detail::asynchronous_state<int>::to_async_future
                                  ((asynchronous_state<int> *)&f0);
                        std::experimental::v1::detail::
                        copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
                        ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                                  (&continuation,&f0);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&f0.ptr_to_state_.
                                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        peVar2->continuation_complete_ = true;
                      }
                      else {
                        p_Var1 = &f0.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount;
                        std::experimental::v1::detail::
                        one_way_executor_then<int,has_execute_member,main::$_1>(std::experimental::v1::detail::async_future<int>&,has_execute_member_const&,main::$_1&&)
                        ::{lambda(std::experimental::v1::detail::async_future<int>)#1}::
                        async_future<int>__1____(p_Var1,&continuation.f);
                        local_58 = (_Manager_type)0x0;
                        p_Stack_50 = (_Invoker_type)0x0;
                        local_68._M_unused._M_object = (void *)0x0;
                        local_68._8_8_ = 0;
                        pvVar5 = operator_new(0x20);
                        std::experimental::v1::detail::
                        one_way_executor_then<int,has_execute_member,main::$_1>(std::experimental::v1::detail::async_future<int>&,has_execute_member_const&,main::$_1&&)
                        ::{lambda(std::experimental::v1::detail::async_future<int>)#1}::
                        async_future<int>__1____((void *)((long)pvVar5 + 8),(type *)p_Var1);
                        p_Stack_50 = std::
                                     _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                     ::_M_invoke;
                        local_58 = std::
                                   _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                   ::_M_manager;
                        local_68._M_unused._M_object = pvVar5;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
                        std::function<void_(std::experimental::v1::detail::async_future<int>)>::
                        operator=(&(peVar2->continuation_).
                                   super_function<void_(std::experimental::v1::detail::async_future<int>)>
                                  ,(function<void_(std::experimental::v1::detail::async_future<int>)>
                                    *)&local_68);
                        std::_Function_base::~_Function_base((_Function_base *)&local_68);
                      }
                      std::unique_lock<std::mutex>::~unique_lock(&lock);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&continuation.f.promise.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      __r = (__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                             *)&f0;
                      f0.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)0x0;
                      f0.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      std::
                      __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ::operator=((__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                   *)&f0_2,__r);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&f0.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_48.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&promise.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      std::experimental::v1::detail::asynchronous_state<void>::wait
                                ((asynchronous_state<void> *)
                                 f1.ptr_to_state_.
                                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,__r);
                      if (result == 0x14) {
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&f1.ptr_to_state_.
                                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&f0_2.ptr_to_state_.
                                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>
                                  ();
                        if (f0_2.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr == (element_type *)0x0) {
                          pcVar7 = "f0.valid()";
                          __line = 0x5b;
                        }
                        else {
                          bVar3 = std::experimental::v1::detail::asynchronous_state<void>::is_ready
                                            ((asynchronous_state<void> *)
                                             f0_2.ptr_to_state_.
                                             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                          if (bVar3) {
                            if (f0_2.ptr_to_state_.
                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr == (element_type *)0x0) {
                              pcVar7 = 
                              "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = void, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:95:29)]"
                              ;
                              goto LAB_00102f42;
                            }
                            std::make_shared<std::experimental::v1::detail::asynchronous_state<int>>
                                      ();
                            std::experimental::v1::promise<int>::get_async_future
                                      ((promise<int> *)&f1);
                            std::experimental::v1::promise<int>::promise(&local_48,&promise);
                            peVar2 = f0_2.ptr_to_state_.
                                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            std::experimental::v1::promise<int>::promise
                                      (&continuation.f.promise,&local_48);
                            std::unique_lock<std::mutex>::unique_lock(&lock,&peVar2->mutex_);
                            if ((peVar2->maybe_result_).has_value_ == true) {
                              std::unique_lock<std::mutex>::unlock(&lock);
                              std::experimental::v1::detail::asynchronous_state<void>::
                              to_async_future((asynchronous_state<void> *)&f0);
                              std::experimental::v1::detail::
                              copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
                              ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                                        (&continuation,(async_future<void> *)&f0);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&f0.ptr_to_state_.
                                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              peVar2->continuation_complete_ = true;
                            }
                            else {
                              p_Var1 = &f0.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                              std::experimental::v1::promise<int>::promise
                                        ((promise<int> *)p_Var1,&continuation.f.promise);
                              local_58 = (_Manager_type)0x0;
                              p_Stack_50 = (_Invoker_type)0x0;
                              local_68._M_unused._M_object = (void *)0x0;
                              local_68._8_8_ = 0;
                              pvVar5 = operator_new(0x20);
                              std::experimental::v1::promise<int>::promise
                                        ((promise<int> *)((long)pvVar5 + 8),(promise<int> *)p_Var1);
                              p_Stack_50 = std::
                                           _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                           ::_M_invoke;
                              local_58 = std::
                                         _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                         ::_M_manager;
                              local_68._M_unused._M_object = pvVar5;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (local_c8);
                              std::
                              function<void_(std::experimental::v1::detail::async_future<void>)>::
                              operator=((function<void_(std::experimental::v1::detail::async_future<void>)>
                                         *)&peVar2->continuation_,
                                        (function<void_(std::experimental::v1::detail::async_future<void>)>
                                         *)&local_68);
                              std::_Function_base::~_Function_base((_Function_base *)&local_68);
                            }
                            std::unique_lock<std::mutex>::~unique_lock(&lock);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&continuation.f.promise.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            f0.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = (element_type *)0x0;
                            f0.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                            ;
                            std::
                            __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                            ::operator=((__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                                         *)&f0_2,(__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&f0);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&f0.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_48.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&promise.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            iVar4 = std::experimental::v1::detail::async_future<int>::get(&f1);
                            if (iVar4 == 0x14) {
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&f1.ptr_to_state_.
                                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&f0_2.ptr_to_state_.
                                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              std::experimental::v1::detail::async_future<void>::
                              make_ready<void,_nullptr>();
                              if (f0_2.ptr_to_state_.
                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr == (element_type *)0x0) {
                                pcVar7 = "f0.valid()";
                                __line = 0x6d;
                              }
                              else {
                                bVar3 = std::experimental::v1::detail::asynchronous_state<void>::
                                        is_ready((asynchronous_state<void> *)
                                                 f0_2.ptr_to_state_.
                                                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr);
                                if (bVar3) {
                                  result = 0;
                                  if (f0_2.ptr_to_state_.
                                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr == (element_type *)0x0) {
                                    pcVar7 = 
                                    "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = void, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:114:29)]"
                                    ;
                                  }
                                  else {
                                    std::
                                    make_shared<std::experimental::v1::detail::asynchronous_state<void>>
                                              ();
                                    std::experimental::v1::promise<void>::get_async_future
                                              ((promise<void> *)&f1);
                                    std::experimental::v1::promise<void>::promise
                                              ((promise<void> *)&local_48,&promise);
                                    local_38 = &result;
                                    std::experimental::v1::detail::
                                    one_way_executor_then<void,has_execute_member,main::$_3>(std::experimental::v1::detail::async_future<void>&,has_execute_member_const&,main::$_3&&)
                                    ::{lambda(std::experimental::v1::detail::async_future<void>)#1}
                                    ::async_future<void>__1____(&continuation.f,(type *)&local_48);
                                    std::unique_lock<std::mutex>::unique_lock
                                              (&lock,&(f0_2.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->mutex_);
                                    if (((f0_2.ptr_to_state_.
                                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->maybe_result_).has_value_ == true) {
                                      std::unique_lock<std::mutex>::unlock(&lock);
                                      std::experimental::v1::detail::asynchronous_state<void>::
                                      to_async_future((asynchronous_state<void> *)&f0);
                                      std::experimental::v1::detail::
                                      copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
                                      ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                                                (&continuation,(async_future<void> *)&f0);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&f0.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      (f0_2.ptr_to_state_.
                                       super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->continuation_complete_ = true;
                                    }
                                    else {
                                      p_Var1 = &f0.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount;
                                      std::experimental::v1::detail::
                                      one_way_executor_then<void,has_execute_member,main::$_3>(std::experimental::v1::detail::async_future<void>&,has_execute_member_const&,main::$_3&&)
                                      ::
                                      {lambda(std::experimental::v1::detail::async_future<void>)#1}
                                      ::async_future<void>__1____(p_Var1,&continuation.f);
                                      local_58 = (_Manager_type)0x0;
                                      p_Stack_50 = (_Invoker_type)0x0;
                                      local_68._M_unused._M_object = (void *)0x0;
                                      local_68._8_8_ = 0;
                                      pvVar5 = operator_new(0x20);
                                      std::experimental::v1::detail::
                                      one_way_executor_then<void,has_execute_member,main::$_3>(std::experimental::v1::detail::async_future<void>&,has_execute_member_const&,main::$_3&&)
                                      ::
                                      {lambda(std::experimental::v1::detail::async_future<void>)#1}
                                      ::async_future<void>__1____
                                                ((void *)((long)pvVar5 + 8),(type *)p_Var1);
                                      p_Stack_50 = std::
                                                  _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                                  ::_M_invoke;
                                      local_58 = std::
                                                 _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                                 ::_M_manager;
                                      local_68._M_unused._M_object = pvVar5;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(local_c8);
                                      std::
                                      function<void_(std::experimental::v1::detail::async_future<void>)>
                                      ::operator=((
                                                  function<void_(std::experimental::v1::detail::async_future<void>)>
                                                  *)&(f0_2.ptr_to_state_.
                                                                                                            
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->continuation_,
                                                  (
                                                  function<void_(std::experimental::v1::detail::async_future<void>)>
                                                  *)&local_68);
                                      std::_Function_base::~_Function_base
                                                ((_Function_base *)&local_68);
                                    }
                                    std::unique_lock<std::mutex>::~unique_lock(&lock);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&continuation.f.promise.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    __r_00 = (__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                                              *)&f0;
                                    f0.ptr_to_state_.
                                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)0x0;
                                    f0.ptr_to_state_.
                                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                    std::
                                    __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                                    ::operator=((__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&f0_2,__r_00);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&f0.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&local_48.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&promise.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    std::experimental::v1::detail::asynchronous_state<void>::wait
                                              ((asynchronous_state<void> *)
                                               f1.ptr_to_state_.
                                               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr,__r_00);
                                    if (result != 0x14) {
                                      pcVar7 = "result == 20";
                                      __line = 0x7a;
                                      goto LAB_00102f27;
                                    }
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&f1.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (&f0_2.ptr_to_state_.
                                                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    std::
                                    make_shared<std::experimental::v1::detail::asynchronous_state<bool>>
                                              ();
                                    std::experimental::v1::promise<bool>::get_async_future
                                              ((promise<bool> *)&f1);
                                    result = result & 0xffffff00;
                                    if (f1.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr != (element_type *)0x0) {
                                      std::
                                      make_shared<std::experimental::v1::detail::asynchronous_state<void>>
                                                ();
                                      std::experimental::v1::promise<void>::get_async_future
                                                (local_30);
                                      std::experimental::v1::promise<void>::promise
                                                ((promise<void> *)&local_48,&promise);
                                      local_38 = &result;
                                      std::experimental::v1::detail::
                                      one_way_executor_then<bool,has_execute_member,main::$_4>(std::experimental::v1::detail::async_future<bool>&,has_execute_member_const&,main::$_4&&)
                                      ::
                                      {lambda(std::experimental::v1::detail::async_future<bool>)#1}
                                      ::async_future<bool>__1____(&continuation.f,(type *)&local_48)
                                      ;
                                      std::unique_lock<std::mutex>::unique_lock
                                                (&lock,&(f1.ptr_to_state_.
                                                                                                                  
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->mutex_);
                                      if (((f1.ptr_to_state_.
                                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->maybe_result_).has_value_ == true) {
                                        std::unique_lock<std::mutex>::unlock(&lock);
                                        std::experimental::v1::detail::asynchronous_state<bool>::
                                        to_async_future((asynchronous_state<bool> *)&f0);
                                        std::experimental::v1::detail::
                                        copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
                                        ::anon_class_32_2_fc850240_for_move_only_function_::
                                        operator()(&continuation,(async_future<bool> *)&f0);
                                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                        ~__shared_count(&f0.ptr_to_state_.
                                                                                                                  
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                        (f1.ptr_to_state_.
                                         super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->continuation_complete_ = true;
                                      }
                                      else {
                                        p_Var1 = &f0.ptr_to_state_.
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount;
                                        std::experimental::v1::detail::
                                        one_way_executor_then<bool,has_execute_member,main::$_4>(std::experimental::v1::detail::async_future<bool>&,has_execute_member_const&,main::$_4&&)
                                        ::
                                        {lambda(std::experimental::v1::detail::async_future<bool>)#1}
                                        ::async_future<bool>__1____(p_Var1,&continuation.f);
                                        local_58 = (_Manager_type)0x0;
                                        p_Stack_50 = (_Invoker_type)0x0;
                                        local_68._M_unused._M_object = (void *)0x0;
                                        local_68._8_8_ = 0;
                                        pvVar5 = operator_new(0x20);
                                        std::experimental::v1::detail::
                                        one_way_executor_then<bool,has_execute_member,main::$_4>(std::experimental::v1::detail::async_future<bool>&,has_execute_member_const&,main::$_4&&)
                                        ::
                                        {lambda(std::experimental::v1::detail::async_future<bool>)#1}
                                        ::async_future<bool>__1____
                                                  ((void *)((long)pvVar5 + 8),(type *)p_Var1);
                                        p_Stack_50 = std::
                                                  _Function_handler<void_(std::experimental::v1::detail::async_future<bool>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                                  ::_M_invoke;
                                        local_58 = std::
                                                  _Function_handler<void_(std::experimental::v1::detail::async_future<bool>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                                                  ::_M_manager;
                                        local_68._M_unused._M_object = pvVar5;
                                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                        ~__shared_count(local_c8);
                                        std::
                                        function<void_(std::experimental::v1::detail::async_future<bool>)>
                                        ::operator=((
                                                  function<void_(std::experimental::v1::detail::async_future<bool>)>
                                                  *)&(f1.ptr_to_state_.
                                                                                                            
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->continuation_,
                                                  (
                                                  function<void_(std::experimental::v1::detail::async_future<bool>)>
                                                  *)&local_68);
                                        std::_Function_base::~_Function_base
                                                  ((_Function_base *)&local_68);
                                      }
                                      std::unique_lock<std::mutex>::~unique_lock(&lock);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&continuation.f.promise.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      f0.ptr_to_state_.
                                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (element_type *)0x0;
                                      f0.ptr_to_state_.
                                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                      std::
                                      __shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                                      ::operator=((
                                                  __shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&f1,(
                                                  __shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&f0);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&f0.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&local_48.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&promise.ptr_to_state_.
                                                                                                              
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(&local_28);
                                      if ((char)result != '\x01') {
                                        f0.ptr_to_state_.
                                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr = (element_type *)
                                                  ((ulong)f0.ptr_to_state_.
                                                                                                                    
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr & 0xffffffffffffff00);
                                        std::experimental::v1::promise<bool>::
                                        set_value_impl<bool,_nullptr>
                                                  ((promise<bool> *)&f0_2,(bool *)&f0);
                                        if ((char)result != '\0') {
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count(&f1.ptr_to_state_.
                                                                                                                      
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count(&f0_2.ptr_to_state_.
                                                                                                                      
                                                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                          poVar6 = std::operator<<((ostream *)&std::cout,"OK");
                                          std::endl<char,std::char_traits<char>>(poVar6);
                                          return 0;
                                        }
                                        __assert_fail("continuation_has_run",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                                                  ,0x8f,"int main()");
                                      }
                                      __assert_fail("!continuation_has_run",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                                                  ,0x8d,"int main()");
                                    }
                                    pcVar7 = 
                                    "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = bool, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:133:9)]"
                                    ;
                                  }
LAB_00102f42:
                                  __assert_fail("predecessor_future.valid()",
                                                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future"
                                                ,0x32e,pcVar7);
                                }
                                pcVar7 = "f0.is_ready()";
                                __line = 0x6e;
                              }
                            }
                            else {
                              pcVar7 = "result == 20";
                              __line = 0x66;
                            }
                          }
                          else {
                            pcVar7 = "f0.is_ready()";
                            __line = 0x5c;
                          }
                        }
                      }
                      else {
                        pcVar7 = "result == 20";
                        __line = 0x54;
                      }
                    }
                    else {
                      pcVar7 = "f0.is_ready()";
                      __line = 0x49;
                    }
                  }
                }
                else {
                  pcVar7 = "result == 20";
                  __line = 0x41;
                }
              }
              else {
                pcVar7 = "f0.is_ready()";
                __line = 0x37;
              }
            }
          }
          else {
            pcVar7 = "f0.is_ready()";
            __line = 0x2f;
          }
        }
      }
      else {
        pcVar7 = "13 == f0.get()";
        __line = 0x27;
      }
    }
    else {
      pcVar7 = "f0.is_ready()";
      __line = 0x25;
    }
  }
LAB_00102f27:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{
  using namespace std::experimental::v1::detail;

  {
    // non-void make_ready()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    assert(13 == f0.get());
  }

  {
    // void make_ready()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());
  }

  {
    // non-void -> non-void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<int> predecessor)
    {
      return predecessor.get() + 7;
    });

    int result = f1.get();

    assert(result == 20);
  }

  {
    // non-void -> void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<int> predecessor)
    {
      result = predecessor.get() + 7;
    });

    f1.wait();

    assert(result == 20);
  }

  {
    // void -> non-void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<void> predecessor)
    {
      predecessor.wait();
      return 20;
    });

    int result = f1.get();
    assert(result == 20);
  }

  {
    // void -> void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<void> predecessor)
    {
      predecessor.wait();
      result = 20;
    });

    f1.wait();

    assert(result == 20);
  }
  {
    // async_future from promise

    std::experimental::promise<bool> p;
    async_future<bool> f = p.get_async_future();
    bool continuation_has_run = false;

    has_execute_member exec;
    f.then(exec,
        [&continuation_has_run]( async_future<bool> predecessor)
        {

            assert(false == predecessor.get());
            continuation_has_run = true;

        });

    assert(!continuation_has_run);
    p.set_value(false);
    assert(continuation_has_run);
  }
  std::cout << "OK" << std::endl;
}